

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

vm_tzobj_ext * vm_tzobj_ext::alloc_ext(CVmObjTimeZone *self,CVmTimeZone *tz)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  CVmTimeZone *in_RSI;
  undefined8 in_RDI;
  vm_tzobj_ext *ext;
  size_t siz;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,8,in_RDI);
  ((vm_tzobj_ext *)CONCAT44(extraout_var,iVar1))->tz = in_RSI;
  return (vm_tzobj_ext *)CONCAT44(extraout_var,iVar1);
}

Assistant:

vm_tzobj_ext *vm_tzobj_ext::alloc_ext(VMG_ CVmObjTimeZone *self,
                                      CVmTimeZone *tz)
{
    /* calculate how much space we need */
    size_t siz = sizeof(vm_tzobj_ext);

    /* allocate the memory */
    vm_tzobj_ext *ext = (vm_tzobj_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* save our TimeZone object */
    ext->tz = tz;

    /* return the new extension */
    return ext;
}